

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-agg.cpp
# Opt level: O0

void __thiscall RasterizerAGG::RasterizerAGG(RasterizerAGG *this,Image *dst,uint32_t options)

{
  uint width;
  uint height;
  int iVar1;
  int iVar2;
  uchar *buf;
  intptr_t iVar3;
  gamma_none local_1d;
  uint32_t local_1c;
  Image *pIStack_18;
  uint32_t options_local;
  Image *dst_local;
  RasterizerAGG *this_local;
  
  local_1c = options;
  pIStack_18 = dst;
  dst_local = (Image *)this;
  Rasterizer::Rasterizer(&this->super_Rasterizer,dst,options);
  (this->super_Rasterizer)._vptr_Rasterizer = (_func_int **)&PTR__RasterizerAGG_00169d78;
  buf = Image::data<unsigned_char>(pIStack_18);
  width = Image::width(pIStack_18);
  height = Image::height(pIStack_18);
  iVar3 = Image::stride(pIStack_18);
  agg::row_accessor<unsigned_char>::row_accessor(&this->_rbuf,buf,width,height,(int)iVar3);
  agg::
  pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>
  ::pixfmt_alpha_blend_rgba(&this->_pixfmt,&this->_rbuf);
  agg::
  renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
  ::renderer_base(&this->_baseRenderer,&this->_pixfmt);
  agg::
  renderer_scanline_aa_solid<agg::renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>_>
  ::renderer_scanline_aa_solid(&this->_solidRenderer,&this->_baseRenderer);
  agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::rasterizer_scanline_aa
            (&this->_rasterizer);
  agg::scanline_p8::scanline_p8(&this->_scanline);
  snprintf((this->super_Rasterizer)._name,0x20,"AGG");
  Rasterizer::addOptionsToName(&this->super_Rasterizer);
  agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::gamma<agg::gamma_none>
            (&this->_rasterizer,&local_1d);
  iVar1 = Image::width(pIStack_18);
  iVar2 = Image::height(pIStack_18);
  agg::rasterizer_scanline_aa<agg::rasterizer_sl_clip<agg::ras_conv_int>_>::clip_box
            (&this->_rasterizer,0.0,0.0,(double)iVar1,(double)iVar2);
  agg::
  renderer_base<agg::pixfmt_alpha_blend_rgba<agg::blender_rgba_pre<agg::rgba8T<agg::linear>,_agg::order_bgra>,_agg::row_accessor<unsigned_char>_>_>
  ::reset_clipping(&this->_baseRenderer,true);
  return;
}

Assistant:

RasterizerAGG::RasterizerAGG(Image& dst, uint32_t options) noexcept
  : Rasterizer(dst, options),
    _rbuf(reinterpret_cast<unsigned char*>(dst.data()), dst.width(), dst.height(), int(dst.stride())),
    _pixfmt(_rbuf),
    _baseRenderer(_pixfmt),
    _solidRenderer(_baseRenderer) {
  std::snprintf(_name, ARRAY_SIZE(_name), "AGG");
  addOptionsToName();

  _rasterizer.gamma(agg::gamma_none());
  _rasterizer.clip_box(0, 0, dst.width(), dst.height());
  _baseRenderer.reset_clipping(true);
}